

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcDivide.c
# Opt level: O2

void Mvc_CoverDivideInternal
               (Mvc_Cover_t *pCover,Mvc_Cover_t *pDiv,Mvc_Cover_t **ppQuo,Mvc_Cover_t **ppRem)

{
  ulong uVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  Mvc_Cube_t *pMVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  Mvc_Cover_t *pCover_00;
  Mvc_Cover_t *pCover_01;
  undefined4 *__ptr;
  long lVar9;
  Mvc_List_t *pMVar10;
  ulong uVar11;
  Mvc_Cube_t **ppMVar12;
  Mvc_Cube_t *pMVar13;
  Mvc_Cube_t **ppMVar14;
  Mvc_Cube_t *pMVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  int _i_;
  uint uVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  ulong uVar24;
  long local_b8;
  Mvc_List_t *pList;
  ulong local_88;
  Mvc_List_t *pList_3;
  
  uVar6 = Mvc_CoverReadCubeNum(pDiv);
  iVar7 = Mvc_CoverReadCubeNum(pCover);
  if (uVar6 == 1) {
    iVar7 = Mvc_CoverIsOneLiteral(pDiv);
    if (iVar7 == 0) {
      Mvc_CoverDivideByCube(pCover,pDiv,ppQuo,ppRem);
      return;
    }
    Mvc_CoverDivideByLiteral(pCover,pDiv,ppQuo,ppRem);
    return;
  }
  pCover_00 = Mvc_CoverAlloc(pCover->pMem,pCover->nBits);
  pCover_01 = Mvc_CoverAlloc(pCover->pMem,pCover->nBits);
  Mvc_CoverAllocateMask(pDiv);
  Mvc_CoverSupport(pDiv,pDiv->pMask);
  Mvc_CoverSort(pDiv,(Mvc_Cube_t *)0x0,Mvc_CubeCompareInt);
  Mvc_CoverSort(pCover,pDiv->pMask,Mvc_CubeCompareIntOutsideAndUnderMask);
  __ptr = (undefined4 *)malloc((long)iVar7 * 4 + 4);
  Mvc_CoverList2Array(pCover);
  Mvc_CoverList2Array(pDiv);
  *__ptr = 0;
  uVar17 = 1;
  for (lVar9 = 1; lVar9 < iVar7; lVar9 = lVar9 + 1) {
    pMVar15 = pCover->pCubes[lVar9 + -1];
    pMVar13 = pCover->pCubes[lVar9];
    uVar20 = *(uint *)&pMVar15->field_0x8 & 0xffffff;
    if (uVar20 == 0) {
      uVar20 = pDiv->pMask->pData[0];
      uVar19 = pMVar15->pData[0] | uVar20;
      uVar20 = uVar20 | pMVar13->pData[0];
LAB_003917c8:
      if (uVar19 != uVar20) goto LAB_003917fa;
    }
    else {
      if (uVar20 == 1) {
        uVar20 = pDiv->pMask->pData[0];
        if ((pMVar15->pData[0] | uVar20) == (uVar20 | pMVar13->pData[0])) {
          uVar20 = *(uint *)&pDiv->pMask->field_0x14;
          uVar19 = *(uint *)&pMVar15->field_0x14 | uVar20;
          uVar20 = uVar20 | *(uint *)&pMVar13->field_0x14;
          goto LAB_003917c8;
        }
      }
      else {
        do {
          if ((int)uVar20 < 0) goto LAB_00391807;
          uVar19 = pDiv->pMask->pData[uVar20];
          uVar24 = (ulong)uVar20;
          uVar11 = (ulong)uVar20;
          uVar20 = uVar20 - 1;
        } while ((pMVar15->pData[uVar24] | uVar19) == (uVar19 | pMVar13->pData[uVar11]));
      }
LAB_003917fa:
      __ptr[(int)uVar17] = (int)lVar9;
      uVar17 = uVar17 + 1;
    }
LAB_00391807:
  }
  __ptr[(int)uVar17] = iVar7;
  pMVar10 = &pCover_01->lCubes;
  uVar24 = (ulong)uVar17;
  if ((int)uVar17 < 1) {
    uVar24 = 0;
  }
  iVar23 = 0;
  uVar11 = 0;
LAB_00391869:
  do {
    while( true ) {
      if (uVar11 == uVar24) {
        if (iVar23 != iVar7) {
          __assert_fail("nCubes == nCubesC",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/mvc/mvcDivide.c"
                        ,0xf6,
                        "void Mvc_CoverDivideInternal(Mvc_Cover_t *, Mvc_Cover_t *, Mvc_Cover_t **, Mvc_Cover_t **)"
                       );
        }
        free(__ptr);
        *ppRem = pCover_01;
        *ppQuo = pCover_00;
        return;
      }
      uVar1 = uVar11 + 1;
      iVar3 = __ptr[uVar11 + 1];
      lVar22 = (long)iVar3;
      iVar4 = __ptr[uVar11];
      lVar18 = (long)iVar4;
      lVar9 = lVar18;
      uVar11 = uVar1;
      if ((int)uVar6 <= iVar3 - iVar4) break;
      for (; lVar18 < lVar22; lVar18 = lVar18 + 1) {
        pMVar13 = Mvc_CubeDup(pCover_01,pCover->pCubes[lVar18]);
        pMVar15 = (Mvc_Cube_t *)pMVar10;
        if ((pCover_01->lCubes).pHead != (Mvc_Cube_t *)0x0) {
          pMVar15 = (pCover_01->lCubes).pTail;
        }
        pMVar15->pNext = pMVar13;
        (pCover_01->lCubes).pTail = pMVar13;
        pMVar13->pNext = (Mvc_Cube_t *)0x0;
        piVar2 = &(pCover_01->lCubes).nItems;
        *piVar2 = *piVar2 + 1;
        iVar23 = iVar23 + 1;
      }
    }
    for (; lVar9 < lVar22; lVar9 = lVar9 + 1) {
      pCover->pCubes[lVar9]->nOnes = 1;
    }
    ppMVar14 = pDiv->pCubes;
    ppMVar12 = pCover->pCubes + lVar18;
    iVar21 = 0;
    lVar9 = 1;
    local_88 = 1;
    while( true ) {
      pMVar15 = *ppMVar14;
      iVar16 = (int)lVar9;
      local_b8 = 0;
      lVar9 = lVar18 * 8 + (long)iVar16 * 8;
      while( true ) {
        pMVar13 = *ppMVar12;
        iVar8 = Mvc_CubeCompareIntUnderMask(pMVar13,pMVar15,pDiv->pMask);
        uVar17 = (uint)local_b8;
        if (iVar8 != -1) break;
        if ((int)(((iVar3 - iVar4) - iVar16) + uVar17) < (int)(uVar6 - iVar21)) goto LAB_00391a64;
        local_b8 = local_b8 + -1;
        ppMVar12 = (Mvc_Cube_t **)(lVar9 + (long)pCover->pCubes);
        lVar9 = lVar9 + 8;
      }
      if (iVar8 == 1) goto LAB_00391a64;
      pMVar13->nOnes = 0;
      if (local_88 == uVar6) break;
      if ((long)(int)uVar6 <= (long)local_88) {
        __assert_fail("iCubeD < nCubesD",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/mvc/mvcDivide.c"
                      ,0xcf,
                      "void Mvc_CoverDivideInternal(Mvc_Cover_t *, Mvc_Cover_t *, Mvc_Cover_t **, Mvc_Cover_t **)"
                     );
      }
      iVar8 = (iVar16 + iVar4) - uVar17;
      if (iVar7 <= iVar8) {
        __assert_fail("pGroups[g]+iCubeC < nCubesC",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/mvc/mvcDivide.c"
                      ,0xd3,
                      "void Mvc_CoverDivideInternal(Mvc_Cover_t *, Mvc_Cover_t *, Mvc_Cover_t **, Mvc_Cover_t **)"
                     );
      }
      iVar21 = iVar21 + 1;
      ppMVar14 = pDiv->pCubes + local_88;
      local_88 = local_88 + 1;
      lVar9 = (iVar16 - local_b8) + 1;
      ppMVar12 = pCover->pCubes + iVar8;
    }
    for (; lVar18 < lVar22; lVar18 = lVar18 + 1) {
      if (pCover->pCubes[lVar18]->nOnes != 0) {
        pMVar13 = Mvc_CubeDup(pCover_01,pCover->pCubes[lVar18]);
        pMVar15 = (Mvc_Cube_t *)pMVar10;
        if ((pCover_01->lCubes).pHead != (Mvc_Cube_t *)0x0) {
          pMVar15 = (pCover_01->lCubes).pTail;
        }
        pMVar15->pNext = pMVar13;
        (pCover_01->lCubes).pTail = pMVar13;
        pMVar13->pNext = (Mvc_Cube_t *)0x0;
        piVar2 = &(pCover_01->lCubes).nItems;
        *piVar2 = *piVar2 + 1;
        iVar23 = iVar23 + 1;
      }
    }
    pMVar13 = Mvc_CubeAlloc(pCover_00);
    pMVar15 = pCover->pCubes[(int)(~uVar17 + iVar16 + iVar4)];
    uVar17 = *(uint *)&pMVar15->field_0x8 & 0xffffff;
    if (uVar17 == 0) {
      pMVar13->pData[0] = ~pDiv->pMask->pData[0] & pMVar15->pData[0];
    }
    else if (uVar17 == 1) {
      pMVar5 = pDiv->pMask;
      pMVar13->pData[0] = ~pMVar5->pData[0] & pMVar15->pData[0];
      *(uint *)&pMVar13->field_0x14 = ~*(uint *)&pMVar5->field_0x14 & *(uint *)&pMVar15->field_0x14;
    }
    else {
      pMVar5 = pDiv->pMask;
      for (; -1 < (int)uVar17; uVar17 = uVar17 - 1) {
        pMVar13->pData[uVar17] = ~pMVar5->pData[uVar17] & pMVar15->pData[uVar17];
      }
    }
    pMVar15 = (Mvc_Cube_t *)&pCover_00->lCubes;
    if ((pCover_00->lCubes).pHead != (Mvc_Cube_t *)0x0) {
      pMVar15 = (pCover_00->lCubes).pTail;
    }
    pMVar15->pNext = pMVar13;
    (pCover_00->lCubes).pTail = pMVar13;
    pMVar13->pNext = (Mvc_Cube_t *)0x0;
    piVar2 = &(pCover_00->lCubes).nItems;
    *piVar2 = *piVar2 + 1;
    iVar23 = iVar23 + uVar6;
  } while( true );
LAB_00391a64:
  for (; lVar18 < lVar22; lVar18 = lVar18 + 1) {
    pMVar13 = Mvc_CubeDup(pCover_01,pCover->pCubes[lVar18]);
    pMVar15 = (Mvc_Cube_t *)pMVar10;
    if ((pCover_01->lCubes).pHead != (Mvc_Cube_t *)0x0) {
      pMVar15 = (pCover_01->lCubes).pTail;
    }
    pMVar15->pNext = pMVar13;
    (pCover_01->lCubes).pTail = pMVar13;
    pMVar13->pNext = (Mvc_Cube_t *)0x0;
    piVar2 = &(pCover_01->lCubes).nItems;
    *piVar2 = *piVar2 + 1;
    iVar23 = iVar23 + 1;
  }
  goto LAB_00391869;
}

Assistant:

void Mvc_CoverDivideInternal( Mvc_Cover_t * pCover, Mvc_Cover_t * pDiv, Mvc_Cover_t ** ppQuo, Mvc_Cover_t ** ppRem )
{
    Mvc_Cover_t * pQuo, * pRem;
    Mvc_Cube_t * pCubeC, * pCubeD, * pCubeCopy;
    Mvc_Cube_t * pCube1, * pCube2;
    int * pGroups, nGroups;    // the cube groups
    int nCubesC, nCubesD, nMerges, iCubeC, iCubeD;
    int iMerge = -1; // Suppress "might be used uninitialized"
    int fSkipG, GroupSize, g, c, RetValue;
    int nCubes;

    // get cover sizes
    nCubesD = Mvc_CoverReadCubeNum( pDiv );
    nCubesC = Mvc_CoverReadCubeNum( pCover );

    // check trivial cases
    if ( nCubesD == 1 )
    {
        if ( Mvc_CoverIsOneLiteral( pDiv ) )
            Mvc_CoverDivideByLiteral( pCover, pDiv, ppQuo, ppRem );
        else
            Mvc_CoverDivideByCube( pCover, pDiv, ppQuo, ppRem );
        return;
    }

    // create the divisor and the remainder 
    pQuo = Mvc_CoverAlloc( pCover->pMem, pCover->nBits );
    pRem = Mvc_CoverAlloc( pCover->pMem, pCover->nBits );

    // get the support of the divisor
    Mvc_CoverAllocateMask( pDiv );
    Mvc_CoverSupport( pDiv, pDiv->pMask );

    // sort the cubes of the divisor
    Mvc_CoverSort( pDiv, NULL, Mvc_CubeCompareInt );
    // sort the cubes of the cover
    Mvc_CoverSort( pCover, pDiv->pMask, Mvc_CubeCompareIntOutsideAndUnderMask );

    // allocate storage for cube groups
    pGroups = MEM_ALLOC( pCover->pMem, int, nCubesC + 1 );

    // mask contains variables in the support of Div
    // split the cubes into groups using the mask
    Mvc_CoverList2Array( pCover );
    Mvc_CoverList2Array( pDiv );
    pGroups[0] = 0;
    nGroups    = 1;
    for ( c = 1; c < nCubesC; c++ )
    {
        // get the cubes
        pCube1 = pCover->pCubes[c-1];
        pCube2 = pCover->pCubes[c  ];
        // compare the cubes
        Mvc_CubeBitEqualOutsideMask( RetValue, pCube1, pCube2, pDiv->pMask );
        if ( !RetValue )
            pGroups[nGroups++] = c;
    }
    // finish off the last group
    pGroups[nGroups] = nCubesC;

    // consider each group separately and decide
    // whether it can produce a quotient cube
    nCubes = 0;
    for ( g = 0; g < nGroups; g++ )
    {
        // if the group has less than nCubesD cubes, 
        // there is no way it can produce the quotient cube
        // copy the cubes to the remainder
        GroupSize = pGroups[g+1] - pGroups[g];
        if ( GroupSize < nCubesD )
        {
            for ( c = pGroups[g]; c < pGroups[g+1]; c++ )
            {
                pCubeCopy = Mvc_CubeDup( pRem, pCover->pCubes[c] );
                Mvc_CoverAddCubeTail( pRem, pCubeCopy );
                nCubes++;
            }
            continue;
        }

        // mark the cubes as those that should be added to the remainder
        for ( c = pGroups[g]; c < pGroups[g+1]; c++ )
            Mvc_CubeSetSize( pCover->pCubes[c], 1 );

        // go through the cubes in the group and at the same time
        // go through the cubes in the divisor
        iCubeD  = 0;
        iCubeC  = 0;
        pCubeD  = pDiv->pCubes[iCubeD++];
        pCubeC  = pCover->pCubes[pGroups[g]+iCubeC++];
        fSkipG  = 0;
        nMerges = 0;

        while ( 1 )
        {
            // compare the topmost cubes in F and in D
            RetValue = Mvc_CubeCompareIntUnderMask( pCubeC, pCubeD, pDiv->pMask );
            // cube are ordered in increasing order of their int value
            if ( RetValue == -1 ) // pCubeC is above pCubeD
            {  // cube in C should be added to the remainder
                // check that there is enough cubes in the group
                if ( GroupSize - iCubeC < nCubesD - nMerges )
                {
                    fSkipG = 1;
                    break;
                }
                // get the next cube in the cover
                pCubeC = pCover->pCubes[pGroups[g]+iCubeC++];
                continue;
            }
            if ( RetValue == 1 ) // pCubeD is above pCubeC
            { // given cube in D does not have a corresponding cube in the cover
                fSkipG = 1;
                break;
            }
            // mark the cube as the one that should NOT be added to the remainder
            Mvc_CubeSetSize( pCubeC, 0 );
            // remember this merged cube
            iMerge = iCubeC-1;
            nMerges++;

            // stop if we considered the last cube of the group
            if ( iCubeD == nCubesD )
                break;

            // advance the cube of the divisor
            assert( iCubeD < nCubesD );
            pCubeD = pDiv->pCubes[iCubeD++];

            // advance the cube of the group
            assert( pGroups[g]+iCubeC < nCubesC );
            pCubeC = pCover->pCubes[pGroups[g]+iCubeC++];
        }

        if ( fSkipG )
        { 
            // the group has failed, add all the cubes to the remainder
            for ( c = pGroups[g]; c < pGroups[g+1]; c++ )
            {
                pCubeCopy = Mvc_CubeDup( pRem, pCover->pCubes[c] );
                Mvc_CoverAddCubeTail( pRem, pCubeCopy );
                nCubes++;
            }
            continue;
        }

        // the group has worked, add left-over cubes to the remainder
        for ( c = pGroups[g]; c < pGroups[g+1]; c++ )
        {
            pCubeC = pCover->pCubes[c];
            if ( Mvc_CubeReadSize(pCubeC) )
            {
                pCubeCopy = Mvc_CubeDup( pRem, pCubeC );
                Mvc_CoverAddCubeTail( pRem, pCubeCopy );
                nCubes++;
            }
        }

        // create the quotient cube
        pCube1 = Mvc_CubeAlloc( pQuo );
        Mvc_CubeBitSharp( pCube1, pCover->pCubes[pGroups[g]+iMerge], pDiv->pMask );
        // add the cube to the quotient
        Mvc_CoverAddCubeTail( pQuo, pCube1 );
        nCubes += nCubesD;
    }
    assert( nCubes == nCubesC );

    // deallocate the memory
    MEM_FREE( pCover->pMem, int, nCubesC + 1, pGroups );

    // return the results
    *ppRem = pRem;
    *ppQuo = pQuo;
//    Mvc_CoverVerifyDivision( pCover, pDiv, pQuo, pRem );
}